

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&> * __thiscall
Catch::ExprLhs<trng::portable_impl::uint128_const&>::operator==
          (BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&>
           *__return_storage_ptr__,ExprLhs<trng::portable_impl::uint128_const&> *this,uint128 *rhs)

{
  uint128 *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  StringRef local_40;
  
  puVar1 = *(uint128 **)this;
  uVar2 = puVar1->m_lo;
  uVar3 = rhs->m_hi;
  uVar4 = rhs->m_lo;
  uVar5 = puVar1->m_hi;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar3 == uVar5 && uVar2 == uVar4;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002eb488;
  __return_storage_ptr__->m_lhs = puVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }